

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ewmh.c
# Opt level: O2

xcb_ewmh_connection_t * ewmh_create(xcb_connection_t *xcb_connection)

{
  char cVar1;
  xcb_ewmh_connection_t *__ptr;
  undefined8 uVar2;
  
  __ptr = (xcb_ewmh_connection_t *)malloc(0x168);
  if (__ptr != (xcb_ewmh_connection_t *)0x0) {
    uVar2 = xcb_ewmh_init_atoms(xcb_connection,__ptr);
    cVar1 = xcb_ewmh_init_atoms_replies(__ptr,uVar2,0);
    if (cVar1 != '\0') {
      return __ptr;
    }
    free(__ptr);
  }
  return (xcb_ewmh_connection_t *)0x0;
}

Assistant:

xcb_ewmh_connection_t *ewmh_create(xcb_connection_t *xcb_connection)
{
        xcb_ewmh_connection_t *ewmh_connection = malloc(sizeof(xcb_ewmh_connection_t));

        if (ewmh_connection == NULL) {
                return NULL;
        }

        xcb_intern_atom_cookie_t *cookie = xcb_ewmh_init_atoms(xcb_connection, ewmh_connection);

        if (xcb_ewmh_init_atoms_replies(ewmh_connection, cookie, NULL) == 0) {
                // Failed to init ewmh
                free(ewmh_connection);

                return NULL;
        }

        return ewmh_connection;
}